

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setListPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,ListReader value,
          BuilderArena *orphanArena,bool canonical)

{
  char *pcVar1;
  word *pwVar2;
  ListElementCount LVar3;
  word *pwVar4;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  WirePointer *pWVar8;
  long lVar9;
  BuilderArena *this;
  byte *pbVar10;
  ulong unaff_RBP;
  uint i;
  ElementCount index;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  SegmentWordCount amount;
  ulong uVar14;
  SegmentBuilder *dstSegment;
  byte *__src;
  WirePointer *unaff_R15;
  long lVar15;
  bool bVar16;
  AllocateResult AVar17;
  AllocateResult AVar18;
  SegmentAnd<capnp::word_*> SVar19;
  long local_100;
  unsigned_long totalSize;
  WirePointer *local_e8;
  WirePointer *local_e0;
  WirePointer *local_d8;
  byte *local_d0;
  size_t local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  Fault f;
  StructReader element;
  unsigned_long newTotalSize;
  
  LVar3 = value.elementCount;
  uVar12 = 0x7ffffff80;
  this = (BuilderArena *)(ulong)value.elementCount;
  uVar14 = (ulong)value.step * (long)this;
  if (uVar14 < 0x7ffffff81) {
    AVar17.words = (word *)ref;
    AVar17.segment = segment;
    uVar14 = uVar14 + 0x3f >> 6;
    totalSize = uVar14;
    if (value.elementSize != INLINE_COMPOSITE) {
      if (orphanArena == (BuilderArena *)0x0) {
        orphanArena = (BuilderArena *)segment;
        if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
          zeroObject(segment,capTable,ref);
        }
        pWVar8 = (WirePointer *)segment->pos;
        if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                   ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar8)) >> 3 <
             (long)uVar14) ||
           (segment->pos = (word *)(pWVar8 + uVar14), pWVar8 == (WirePointer *)0x0)) {
          orphanArena = (BuilderArena *)(segment->super_SegmentReader).arena;
          AVar17 = BuilderArena::allocate(orphanArena,(SegmentWordCount)uVar14 + 1);
          (ref->offsetAndKind).value =
               (int)AVar17.words - *(int *)&((AVar17.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                         ((AVar17.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar17.words)->content = 1;
          pWVar8 = (WirePointer *)(AVar17.words + 1);
        }
        else {
          (ref->offsetAndKind).value =
               ((uint)((ulong)((long)pWVar8 - (long)ref) >> 1) & 0xfffffffc) - 3;
        }
      }
      else {
        AVar18 = BuilderArena::allocate(orphanArena,(SegmentWordCount)uVar14);
        pWVar8 = (WirePointer *)AVar18.words;
        AVar17.segment = AVar18.segment;
        (ref->offsetAndKind).value = 0xfffffffd;
      }
      unaff_R15 = (WirePointer *)AVar17.words;
      dstSegment = AVar17.segment;
      this = (BuilderArena *)(ulong)value.elementCount;
      local_e8 = pWVar8;
      if (value.elementSize == 6) {
        (unaff_R15->field_1).upper32Bits = value.elementCount * 8 | 6;
        if (this != (BuilderArena *)0x0) {
          lVar15 = 8;
          lVar13 = -8;
          do {
            lVar9 = (long)(*(int *)(value.ptr + lVar15 + -8) >> 2);
            if (value.segment == (SegmentReader *)0x0) {
              pwVar4 = (word *)(value.ptr + lVar15 + lVar9 * 8);
            }
            else {
              pwVar2 = ((value.segment)->ptr).ptr;
              pwVar4 = pwVar2 + ((value.segment)->ptr).size_;
              if (((long)pwVar2 + (lVar13 - (long)value.ptr) >> 3 <= lVar9) &&
                 (lVar9 <= (long)pwVar4 + (lVar13 - (long)value.ptr) >> 3)) {
                pwVar4 = (word *)(value.ptr + lVar15 + lVar9 * 8);
              }
            }
            copyPointer(dstSegment,capTable,pWVar8,value.segment,value.capTable,
                        (WirePointer *)(value.ptr + lVar15 + -8),pwVar4,value.nestingLimit,
                        (BuilderArena *)0x0,canonical);
            pWVar8 = pWVar8 + 1;
            lVar15 = lVar15 + 8;
            lVar9 = (long)this * 8 + lVar13;
            lVar13 = lVar13 + -8;
          } while (lVar9 != 0);
        }
        goto LAB_0017c493;
      }
      (unaff_R15->field_1).upper32Bits = value.elementCount * 8 | (uint)value.elementSize;
      uVar6 = (ulong)value.step * (long)this;
      uVar12 = 0x7ffffffc7;
      if (uVar6 < 0x7ffffffc8) {
        uVar12 = uVar6 >> 3;
        if (7 < uVar6) {
          memcpy(pWVar8,value.ptr,uVar12);
          uVar6 = (ulong)value.step * (ulong)value.elementCount;
        }
        if ((uVar6 & 7) != 0) {
          *(byte *)((long)&(pWVar8->offsetAndKind).value + uVar12) =
               ~(-1 << (sbyte)(uVar6 & 7)) & value.ptr[uVar12];
        }
        goto LAB_0017c493;
      }
      goto LAB_0017c4ad;
    }
    local_d0 = (byte *)(ulong)(value.structDataSize >> 6);
    local_d8 = (WirePointer *)CONCAT62(local_d8._2_6_,value.structPointerCount);
    if (canonical) {
      uVar14 = 0;
      local_e0 = ref;
      if (value.elementCount == 0) {
        unaff_RBP = 0;
        uVar12 = 0;
      }
      else {
        unaff_RBP = 0;
        index = 0;
        uVar12 = uVar14;
        do {
          ListReader::getStructElement(&element,&value,index);
          pvVar7 = (void *)((ulong)(element.dataSize >> 3) + (long)element.data);
          uVar11 = (element.dataSize >> 3) + 7;
          do {
            uVar5 = uVar11;
            if (pvVar7 <= element.data) break;
            pcVar1 = (char *)((long)pvVar7 - 1);
            pvVar7 = (void *)((long)pvVar7 - 1);
            uVar11 = uVar5 - 1;
          } while (*pcVar1 == '\0');
          uVar5 = uVar5 >> 3;
          uVar14 = uVar12 & 0xffff;
          uVar12 = (ulong)uVar5;
          if (uVar5 <= (uint)uVar14) {
            uVar12 = uVar14;
          }
          lVar13 = (ulong)element.pointerCount << 3;
          do {
            lVar15 = lVar13;
            pWVar8 = (WirePointer *)((long)&((element.pointers)->offsetAndKind).value + lVar15);
            if (pWVar8 <= element.pointers) break;
            lVar13 = lVar15 + -8;
          } while (pWVar8[-1].field_1.upper32Bits == 0 && pWVar8[-1].offsetAndKind.value == 0);
          uVar14 = unaff_RBP & 0xffff;
          unaff_RBP = lVar15 >> 3;
          if (lVar15 >> 3 <= (long)uVar14) {
            unaff_RBP = uVar14;
          }
          index = index + 1;
        } while (index != LVar3);
        uVar14 = (ulong)value.elementCount;
      }
      uVar14 = ((unaff_RBP & 0xffff) + (uVar12 & 0xffff)) * uVar14;
      element.segment = (SegmentReader *)&newTotalSize;
      element.capTable = (CapTableReader *)&totalSize;
      element.data = anon_var_dwarf_19a347;
      element.pointers = (WirePointer *)0x5;
      bVar16 = uVar14 - totalSize == 0;
      element.dataSize = CONCAT31(element.dataSize._1_3_,uVar14 < totalSize || bVar16);
      ref = local_e0;
      newTotalSize = uVar14;
      if (uVar14 >= totalSize && !bVar16) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x772,FAILED,"newTotalSize <= totalSize","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long_&> *)&element);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else {
      unaff_RBP = (ulong)value.structPointerCount;
      uVar12 = (ulong)(value.structDataSize >> 6);
    }
    AVar18.words = (word *)ref;
    AVar18.segment = segment;
    uVar11 = (int)uVar14 + 1;
    totalSize = uVar14;
    if (orphanArena == (BuilderArena *)0x0) {
      if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
        zeroObject(segment,capTable,ref);
      }
      local_e8 = (WirePointer *)segment->pos;
      if (((long)(ulong)uVar11 <=
           (long)((long)(segment->super_SegmentReader).ptr.ptr +
                 ((segment->super_SegmentReader).ptr.size_ * 8 - (long)local_e8)) >> 3) &&
         (segment->pos = (word *)(local_e8 + uVar11), local_e8 != (WirePointer *)0x0)) {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)local_e8 - (long)ref) >> 1) & 0xfffffffc) - 3;
        goto LAB_0017c28f;
      }
      amount = (int)uVar14 + 2;
      this = (BuilderArena *)(segment->super_SegmentReader).arena;
      unaff_R15 = ref;
      if (0x1fffffff < amount) goto LAB_0017c4b2;
      goto LAB_0017c251;
    }
    AVar17 = BuilderArena::allocate(orphanArena,uVar11);
    local_e8 = (WirePointer *)AVar17.words;
    AVar18.segment = AVar17.segment;
    (ref->offsetAndKind).value = 0xfffffffd;
  }
  else {
    setListPointer::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)segment);
    orphanArena = (BuilderArena *)segment;
LAB_0017c4ad:
    amount = (SegmentWordCount)uVar14;
    setListPointer::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)orphanArena);
LAB_0017c4b2:
    allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&element);
LAB_0017c251:
    AVar18 = BuilderArena::allocate(this,amount);
    (unaff_R15->offsetAndKind).value =
         (int)AVar18.words - *(int *)&((AVar18.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
         | 2;
    unaff_R15->field_1 =
         (anon_union_4_5_35ddcec3_for_WirePointer_1)((AVar18.segment)->super_SegmentReader).id.value
    ;
    *(undefined4 *)&(AVar18.words)->content = 1;
    local_e8 = (WirePointer *)(AVar18.words + 1);
  }
LAB_0017c28f:
  dstSegment = AVar18.segment;
  *(int *)((long)&(AVar18.words)->content + 4) = (int)totalSize * 8 + 7;
  local_78 = (ulong)value.elementCount;
  (local_e8->offsetAndKind).value = value.elementCount * 4;
  (local_e8->field_1).structRef.dataSize.value = (unsigned_short)uVar12;
  (local_e8->field_1).structRef.ptrCount.value = (unsigned_short)unaff_RBP;
  if (value.elementCount != 0) {
    local_90 = (ulong)local_d8 & 0xffff;
    pWVar8 = local_e8 + 1;
    local_98 = uVar12 & 0xffff;
    local_c8 = (size_t)(uint)((int)local_98 << 3);
    local_a0 = (ulong)local_d0 & 0xffff;
    local_a8 = unaff_RBP & 0xffff;
    lVar13 = (long)&local_e8[1].offsetAndKind.value + local_c8;
    uVar14 = (ulong)(uint)((int)local_a8 << 3);
    local_b0 = local_c8 + uVar14;
    pbVar10 = value.ptr + (uint)(ushort)local_d0 * 8;
    local_b8 = (ulong)((uint)(ushort)local_d0 * 8) + local_90 * 8;
    local_100 = -8 - (long)pbVar10;
    local_c0 = -local_b8;
    local_e0 = (WirePointer *)0x0;
    __src = value.ptr;
    local_88 = uVar12;
    local_80 = unaff_RBP;
    do {
      if ((short)local_88 != 0) {
        memcpy(pWVar8,__src,local_c8);
      }
      local_d8 = pWVar8;
      local_d0 = __src;
      if ((short)local_80 != 0) {
        uVar12 = 0;
        lVar15 = local_100;
        do {
          lVar9 = (long)(*(int *)(pbVar10 + uVar12) >> 2);
          if (value.segment == (SegmentReader *)0x0) {
            pwVar4 = (word *)(pbVar10 + uVar12 + lVar9 * 8 + 8);
          }
          else {
            pwVar2 = ((value.segment)->ptr).ptr;
            pwVar4 = pwVar2 + ((value.segment)->ptr).size_;
            if (((long)&pwVar2->content + lVar15 >> 3 <= lVar9) &&
               (lVar9 <= (long)&pwVar4->content + lVar15 >> 3)) {
              pwVar4 = (word *)(pbVar10 + uVar12 + lVar9 * 8 + 8);
            }
          }
          copyPointer(dstSegment,capTable,(WirePointer *)(lVar13 + uVar12),value.segment,
                      value.capTable,(WirePointer *)(pbVar10 + uVar12),pwVar4,value.nestingLimit,
                      (BuilderArena *)0x0,canonical);
          uVar12 = uVar12 + 8;
          lVar15 = lVar15 + -8;
        } while (uVar14 != uVar12);
      }
      pWVar8 = local_d8 + local_98 + local_a8;
      __src = local_d0 + local_90 * 8 + local_a0 * 8;
      uVar11 = (int)local_e0 + 1;
      local_e0 = (WirePointer *)(ulong)uVar11;
      lVar13 = lVar13 + local_b0;
      pbVar10 = pbVar10 + local_b8;
      local_100 = local_100 + local_c0;
    } while (uVar11 != (uint)local_78);
  }
LAB_0017c493:
  SVar19.value = (word *)local_e8;
  SVar19.segment = dstSegment;
  return SVar19;
}

Assistant:

static SegmentAnd<word*> setListPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, ListReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto totalSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
        roundBitsUpToWords(upgradeBound<uint64_t>(value.elementCount) * value.step),
        []() { KJ_FAIL_ASSERT("encountered impossibly long struct list ListReader"); });

    if (value.elementSize != ElementSize::INLINE_COMPOSITE) {
      // List of non-structs.
      word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::LIST, orphanArena);

      if (value.elementSize == ElementSize::POINTER) {
        // List of pointers.
        ref->listRef.set(ElementSize::POINTER, value.elementCount);
        for (auto i: kj::zeroTo(value.elementCount * (ONE * POINTERS / ELEMENTS))) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(ptr) + i,
                      value.segment, value.capTable,
                      reinterpret_cast<const WirePointer*>(value.ptr) + i,
                      value.nestingLimit, nullptr, canonical);
        }
      } else {
        // List of data.
        ref->listRef.set(value.elementSize, value.elementCount);

        auto wholeByteSize =
          assertMax(MAX_SEGMENT_WORDS * BYTES_PER_WORD,
            upgradeBound<uint64_t>(value.elementCount) * value.step / BITS_PER_BYTE,
            []() { KJ_FAIL_ASSERT("encountered impossibly long data ListReader"); });
        copyMemory(reinterpret_cast<byte*>(ptr), value.ptr, wholeByteSize);
        auto leftoverBits =
          (upgradeBound<uint64_t>(value.elementCount) * value.step) % BITS_PER_BYTE;
        if (leftoverBits > ZERO * BITS) {
          // We need to copy a partial byte.
          uint8_t mask = (1 << unbound(leftoverBits / BITS)) - 1;
          *((reinterpret_cast<byte*>(ptr)) + wholeByteSize) = mask & *(value.ptr + wholeByteSize);
        }
      }

      return { segment, ptr };
    } else {
      // List of structs.
      StructDataWordCount declDataSize = value.structDataSize / BITS_PER_WORD;
      StructPointerCount declPointerCount = value.structPointerCount;

      StructDataWordCount dataSize = ZERO * WORDS;
      StructPointerCount ptrCount = ZERO * POINTERS;

      if (canonical) {
        for (auto i: kj::zeroTo(value.elementCount)) {
          auto element = value.getStructElement(i);

          // Truncate the data section
          auto data = element.getDataSectionAsBlob();
          auto end = data.end();
          while (end > data.begin() && end[-1] == 0) --end;
          dataSize = kj::max(dataSize, roundBytesUpToWords(
              intervalLength(data.begin(), end, MAX_STRUCT_DATA_WORDS * BYTES_PER_WORD)));

          // Truncate pointer section
          const WirePointer* ptr = element.pointers + element.pointerCount;
          while (ptr > element.pointers && ptr[-1].isNull()) --ptr;
          ptrCount = kj::max(ptrCount,
              intervalLength(element.pointers, ptr, MAX_STRUCT_POINTER_COUNT));
        }
        auto newTotalSize = (dataSize + upgradeBound<uint64_t>(ptrCount) * WORDS_PER_POINTER)
            / ELEMENTS * value.elementCount;
        KJ_ASSERT(newTotalSize <= totalSize);  // we've only removed data!
        totalSize = assumeMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(newTotalSize);
      } else {
        dataSize = declDataSize;
        ptrCount = declPointerCount;
      }

      KJ_DASSERT(value.structDataSize % BITS_PER_WORD == ZERO * BITS);
      word* ptr = allocate(ref, segment, capTable, totalSize + POINTER_SIZE_IN_WORDS,
                           WirePointer::LIST, orphanArena);
      ref->listRef.setInlineComposite(totalSize);

      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, value.elementCount);
      tag->structRef.set(dataSize, ptrCount);
      word* dst = ptr + POINTER_SIZE_IN_WORDS;

      const word* src = reinterpret_cast<const word*>(value.ptr);
      for (auto i KJ_UNUSED: kj::zeroTo(value.elementCount)) {
        copyMemory(dst, src, dataSize);
        dst += dataSize;
        src += declDataSize;

        for (auto j: kj::zeroTo(ptrCount)) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(dst) + j,
              value.segment, value.capTable, reinterpret_cast<const WirePointer*>(src) + j,
              value.nestingLimit, nullptr, canonical);
        }
        dst += ptrCount * WORDS_PER_POINTER;
        src += declPointerCount * WORDS_PER_POINTER;
      }

      return { segment, ptr };
    }
  }